

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorButton(char *desc_id,ImVec4 *col,ImGuiColorEditFlags flags,ImVec2 *size_arg)

{
  undefined8 uVar1;
  ImVec2 grid_off;
  ImVec2 grid_off_00;
  bool bVar2;
  float fVar3;
  ImVec2 size_arg_00;
  ImVec2 in_RCX;
  float in_EDX;
  ImVec2 in_RSI;
  ImVec2 *min;
  float fVar4;
  float flags_00;
  ImVec4 col_source;
  float mid_x;
  float off;
  ImRect bb_inner;
  float rounding;
  float grid_step;
  ImVec4 col_rgb_without_alpha;
  ImVec4 col_rgb;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  float default_size;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe4c;
  ImRect *in_stack_fffffffffffffe50;
  ImDrawFlags flags_01;
  undefined8 in_stack_fffffffffffffe58;
  ImGuiCond cond;
  float in_stack_fffffffffffffe60;
  ImGuiCol in_stack_fffffffffffffe64;
  ImDrawList *in_stack_fffffffffffffe68;
  ImGuiWindow *in_stack_fffffffffffffe70;
  ImRect *in_stack_fffffffffffffe78;
  ImGuiDragDropFlags flags_02;
  float *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  ImDrawList *in_stack_fffffffffffffe98;
  ImDrawList *draw_list;
  float in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  ImVec2 in_stack_fffffffffffffea8;
  ImVec2 in_stack_fffffffffffffeb0;
  ImU32 in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  ImDrawList *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  ImGuiID id_00;
  float in_stack_fffffffffffffed0;
  float flags_03;
  ImVec2 *this;
  ImGuiNavHighlightFlags in_stack_fffffffffffffee8;
  float _y;
  float fVar5;
  float fVar6;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_ac;
  float local_a4;
  float local_a0;
  ImRect local_9c;
  float in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  undefined8 local_74;
  undefined8 local_6c;
  byte local_63;
  byte local_61;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImVec2 local_48;
  float local_40;
  float local_3c;
  ImVec2 local_38;
  float flags_04;
  float in_stack_ffffffffffffffe0;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  size_arg_00 = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)size_arg_00 + 0x9b) & 1U) == 0) {
    local_38 = (ImVec2)GImGui;
    local_3c = (float)ImGuiWindow::GetID(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68
                                         ,(char *)CONCAT44(in_stack_fffffffffffffe64,
                                                           in_stack_fffffffffffffe60));
    local_40 = GetFrameHeight();
    if ((*(float *)in_RCX != 0.0) || (fVar5 = local_40, NAN(*(float *)in_RCX))) {
      fVar5 = *(float *)in_RCX;
    }
    if ((*(float *)((long)in_RCX + 4) != 0.0) || (_y = local_40, NAN(*(float *)((long)in_RCX + 4))))
    {
      _y = *(float *)((long)in_RCX + 4);
    }
    this = &local_48;
    fVar6 = fVar5;
    ImVec2::ImVec2(this,fVar5,_y);
    flags_04 = in_RCX.y;
    min = (ImVec2 *)((long)size_arg_00 + 0xe0);
    local_60 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           (ImVec2 *)0x500e3e);
    ImRect::ImRect((ImRect *)local_58,min,&local_60);
    if (local_48.y < local_40) {
      flags_03 = 0.0;
    }
    else {
      flags_03 = *(float *)((long)local_38 + 0x3820);
    }
    ItemSize(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    flags_01 = (ImDrawFlags)((ulong)in_stack_fffffffffffffe50 >> 0x20);
    bVar2 = ItemAdd(in_stack_fffffffffffffe78,(ImGuiID)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                    (ImRect *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    if (bVar2) {
      local_63 = ButtonBehavior((ImRect *)CONCAT44(flags_03,in_stack_fffffffffffffed0),id_00,
                                (bool *)in_stack_fffffffffffffec0,
                                (bool *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ),(ImGuiButtonFlags)in_stack_fffffffffffffeb0.y);
      if (((uint)in_EDX & 2) != 0) {
        in_EDX = (float)((uint)in_EDX & 0xfff9ffff);
      }
      local_74 = *(undefined8 *)in_RSI;
      local_6c = *(undefined8 *)((long)in_RSI + 8);
      if (((uint)in_EDX & 0x10000000) != 0) {
        ColorConvertHSVtoRGB
                  ((float)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                   (float)in_stack_fffffffffffffe90,
                   (float)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80,
                   (float *)in_stack_fffffffffffffe78,(float *)in_stack_fffffffffffffe70);
      }
      flags_02 = (ImGuiDragDropFlags)in_stack_fffffffffffffe80;
      ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff7c,(float)local_74,local_74._4_4_,
                     (float)local_6c,1.0);
      fVar4 = ImMin<float>(local_48.x,local_48.y);
      fVar4 = fVar4 / 2.99;
      flags_00 = ImMin<float>(*(float *)((long)local_38 + 0x3824),fVar4 * 0.5);
      local_9c.Min.x = (float)local_58._0_4_;
      local_9c.Min.y = (float)local_58._4_4_;
      local_9c.Max.x = (float)local_58._8_4_;
      local_9c.Max.y = (float)local_58._12_4_;
      local_a0 = 0.0;
      if (((uint)in_EDX & 0x400) == 0) {
        local_a0 = -0.75;
        ImRect::Expand(&local_9c,-0.75);
      }
      if ((((uint)in_EDX & 0x40000) == 0) || (1.0 <= local_6c._4_4_)) {
        if (((uint)in_EDX & 0x20000) == 0) {
          in_stack_fffffffffffffea8 = (ImVec2)&stack0xffffffffffffff7c;
        }
        else {
          in_stack_fffffffffffffea8 = (ImVec2)&local_74;
        }
        local_d8 = *(undefined8 *)in_stack_fffffffffffffea8;
        uVar1 = *(undefined8 *)((long)in_stack_fffffffffffffea8 + 8);
        local_d0._4_4_ = (float)((ulong)uVar1 >> 0x20);
        local_d0 = uVar1;
        if (1.0 <= local_d0._4_4_) {
          flags_02 = (ImGuiDragDropFlags)*(ImDrawList **)((long)size_arg_00 + 0x278);
          GetColorU32((ImVec4 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          ImDrawList::AddRectFilled
                    ((ImDrawList *)in_stack_fffffffffffffe70,(ImVec2 *)in_stack_fffffffffffffe68,
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     (ImU32)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     (float)in_stack_fffffffffffffe58,flags_01);
          cond = (ImGuiCond)((ulong)in_stack_fffffffffffffe58 >> 0x20);
        }
        else {
          draw_list = *(ImDrawList **)((long)size_arg_00 + 0x278);
          local_e0 = local_9c.Min;
          local_e8 = local_9c.Max;
          in_stack_fffffffffffffea4 = fVar4;
          fVar3 = (float)GetColorU32((ImVec4 *)
                                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          cond = (ImGuiCond)((ulong)in_stack_fffffffffffffe58 >> 0x20);
          fVar4 = in_stack_fffffffffffffea4;
          ImVec2::ImVec2(&local_f0,local_a0,local_a0);
          grid_off_00.y = in_stack_fffffffffffffea4;
          grid_off_00.x = fVar3;
          RenderColorRectWithAlphaCheckerboard
                    (draw_list,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     (ImU32)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                     (float)in_stack_fffffffffffffe90,grid_off_00,
                     (float)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                     (ImDrawFlags)in_stack_fffffffffffffe88);
        }
      }
      else {
        local_a4 = (float)(int)((local_9c.Min.x + local_9c.Max.x) * 0.5 + 0.5);
        in_stack_fffffffffffffeb0 = *(ImVec2 *)((long)size_arg_00 + 0x278);
        ImVec2::ImVec2(&local_ac,local_9c.Min.x + fVar4,local_9c.Min.y);
        local_b8 = local_9c.Max;
        in_stack_fffffffffffffebc = fVar4;
        in_stack_fffffffffffffeb8 =
             GetColorU32((ImVec4 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        fVar4 = in_stack_fffffffffffffebc;
        ImVec2::ImVec2(&local_c0,local_a0 - in_stack_fffffffffffffebc,local_a0);
        grid_off.y = in_stack_fffffffffffffea4;
        grid_off.x = in_stack_fffffffffffffea0;
        RenderColorRectWithAlphaCheckerboard
                  (in_stack_fffffffffffffe98,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                   (ImU32)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                   (float)in_stack_fffffffffffffe90,grid_off,
                   (float)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   (ImDrawFlags)in_stack_fffffffffffffe88);
        in_stack_fffffffffffffec0 = *(ImDrawList **)((long)size_arg_00 + 0x278);
        ImVec2::ImVec2(&local_c8,local_a4,local_9c.Max.y);
        GetColorU32((ImVec4 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        ImDrawList::AddRectFilled
                  ((ImDrawList *)in_stack_fffffffffffffe70,(ImVec2 *)in_stack_fffffffffffffe68,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (ImU32)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   (float)in_stack_fffffffffffffe58,flags_01);
        cond = (ImGuiCond)((ulong)in_stack_fffffffffffffe58 >> 0x20);
      }
      RenderNavHighlight((ImRect *)CONCAT44(fVar6,fVar5),(ImGuiID)_y,in_stack_fffffffffffffee8);
      if (((uint)in_EDX & 0x400) == 0) {
        if (*(float *)((long)local_38 + 0x3828) <= 0.0) {
          in_stack_fffffffffffffe68 = *(ImDrawList **)((long)size_arg_00 + 0x278);
          in_stack_fffffffffffffe70 = (ImGuiWindow *)local_58;
          GetColorU32(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
          ImDrawList::AddRect((ImDrawList *)CONCAT44(fVar6,fVar5),
                              (ImVec2 *)CONCAT44(_y,in_stack_fffffffffffffee8),min,
                              (ImU32)((ulong)this >> 0x20),SUB84(this,0),(ImDrawFlags)flags_03,
                              in_stack_fffffffffffffed0);
        }
        else {
          local_f8.x = (float)local_58._0_4_;
          local_f8.y = (float)local_58._4_4_;
          local_100.x = (float)local_58._8_4_;
          local_100.y = (float)local_58._12_4_;
          RenderFrameBorder(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea4);
        }
      }
      fVar5 = in_stack_fffffffffffffeb0.y;
      if (((*(float *)((long)local_38 + 0x3eec) == local_3c) && (((uint)in_EDX & 0x200) == 0)) &&
         (bVar2 = BeginDragDropSource(flags_02), bVar2)) {
        if (((uint)in_EDX & 2) == 0) {
          SetDragDropPayload((char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),cond);
        }
        else {
          SetDragDropPayload((char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),cond);
        }
        ImVec2::ImVec2(&local_108,0.0,0.0);
        ColorButton((char *)in_RSI,(ImVec4 *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (ImGuiColorEditFlags)flags_04,(ImVec2 *)size_arg_00);
        SameLine(0.0,-1.0);
        TextEx(in_stack_ffffffffffffff80,(char *)CONCAT44(in_stack_ffffffffffffff7c,fVar4),
               (ImGuiTextFlags)flags_00);
        EndDragDropSource();
      }
      if ((((uint)in_EDX & 0x40) == 0) && ((local_61 & 1) != 0)) {
        ColorTooltip((char *)in_stack_fffffffffffffec0,
                     (float *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (ImGuiColorEditFlags)fVar5);
      }
      local_1 = (bool)(local_63 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ColorButton(const char* desc_id, const ImVec4& col, ImGuiColorEditFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(desc_id);
    const float default_size = GetFrameHeight();
    const ImVec2 size(size_arg.x == 0.0f ? default_size : size_arg.x, size_arg.y == 0.0f ? default_size : size_arg.y);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(bb, (size.y >= default_size) ? g.Style.FramePadding.y : 0.0f);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    if (flags & ImGuiColorEditFlags_NoAlpha)
        flags &= ~(ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf);

    ImVec4 col_rgb = col;
    if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(col_rgb.x, col_rgb.y, col_rgb.z, col_rgb.x, col_rgb.y, col_rgb.z);

    ImVec4 col_rgb_without_alpha(col_rgb.x, col_rgb.y, col_rgb.z, 1.0f);
    float grid_step = ImMin(size.x, size.y) / 2.99f;
    float rounding = ImMin(g.Style.FrameRounding, grid_step * 0.5f);
    ImRect bb_inner = bb;
    float off = 0.0f;
    if ((flags & ImGuiColorEditFlags_NoBorder) == 0)
    {
        off = -0.75f; // The border (using Col_FrameBg) tends to look off when color is near-opaque and rounding is enabled. This offset seemed like a good middle ground to reduce those artifacts.
        bb_inner.Expand(off);
    }
    if ((flags & ImGuiColorEditFlags_AlphaPreviewHalf) && col_rgb.w < 1.0f)
    {
        float mid_x = IM_ROUND((bb_inner.Min.x + bb_inner.Max.x) * 0.5f);
        RenderColorRectWithAlphaCheckerboard(window->DrawList, ImVec2(bb_inner.Min.x + grid_step, bb_inner.Min.y), bb_inner.Max, GetColorU32(col_rgb), grid_step, ImVec2(-grid_step + off, off), rounding, ImDrawFlags_RoundCornersRight);
        window->DrawList->AddRectFilled(bb_inner.Min, ImVec2(mid_x, bb_inner.Max.y), GetColorU32(col_rgb_without_alpha), rounding, ImDrawFlags_RoundCornersLeft);
    }
    else
    {
        // Because GetColorU32() multiplies by the global style Alpha and we don't want to display a checkerboard if the source code had no alpha
        ImVec4 col_source = (flags & ImGuiColorEditFlags_AlphaPreview) ? col_rgb : col_rgb_without_alpha;
        if (col_source.w < 1.0f)
            RenderColorRectWithAlphaCheckerboard(window->DrawList, bb_inner.Min, bb_inner.Max, GetColorU32(col_source), grid_step, ImVec2(off, off), rounding);
        else
            window->DrawList->AddRectFilled(bb_inner.Min, bb_inner.Max, GetColorU32(col_source), rounding);
    }
    RenderNavHighlight(bb, id);
    if ((flags & ImGuiColorEditFlags_NoBorder) == 0)
    {
        if (g.Style.FrameBorderSize > 0.0f)
            RenderFrameBorder(bb.Min, bb.Max, rounding);
        else
            window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_FrameBg), rounding); // Color button are often in need of some sort of border
    }

    // Drag and Drop Source
    // NB: The ActiveId test is merely an optional micro-optimization, BeginDragDropSource() does the same test.
    if (g.ActiveId == id && !(flags & ImGuiColorEditFlags_NoDragDrop) && BeginDragDropSource())
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_3F, &col_rgb, sizeof(float) * 3, ImGuiCond_Once);
        else
            SetDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_4F, &col_rgb, sizeof(float) * 4, ImGuiCond_Once);
        ColorButton(desc_id, col, flags);
        SameLine();
        TextEx("Color");
        EndDragDropSource();
    }

    // Tooltip
    if (!(flags & ImGuiColorEditFlags_NoTooltip) && hovered)
        ColorTooltip(desc_id, &col.x, flags & (ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf));

    return pressed;
}